

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O0

void xmlXPtrEvalXPtrPart(xmlXPathParserContextPtr ctxt,xmlChar *name)

{
  xmlChar *pxVar1;
  int iVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  bool bVar6;
  xmlChar *prefix;
  xmlChar *oldCur_2;
  xmlChar *oldBase_2;
  xmlChar *name2;
  xmlChar *oldCur_1;
  xmlChar *oldBase_1;
  xmlChar *oldCur;
  xmlChar *oldBase;
  int level;
  int len;
  xmlChar *cur;
  xmlChar *buffer;
  xmlChar *name_local;
  xmlXPathParserContextPtr ctxt_local;
  
  buffer = name;
  if (name == (xmlChar *)0x0) {
    buffer = xmlXPathParseName(ctxt);
  }
  if (buffer == (xmlChar *)0x0) {
    xmlXPathErr(ctxt,7);
  }
  else if (*ctxt->cur == '(') {
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
    oldBase._0_4_ = 1;
    iVar2 = xmlStrlen(ctxt->cur);
    pxVar3 = (xmlChar *)(*xmlMalloc)((long)(iVar2 + 1));
    _level = pxVar3;
    if (pxVar3 == (xmlChar *)0x0) {
      xmlXPathPErrMemory(ctxt);
      (*xmlFree)(buffer);
    }
    else {
      while (*ctxt->cur != '\0') {
        if (*ctxt->cur == ')') {
          oldBase._0_4_ = (int)oldBase + -1;
          if ((int)oldBase == 0) {
            if (*ctxt->cur != '\0') {
              ctxt->cur = ctxt->cur + 1;
            }
            break;
          }
        }
        else if (*ctxt->cur == '(') {
          oldBase._0_4_ = (int)oldBase + 1;
        }
        else if ((*ctxt->cur == '^') &&
                ((((ctxt->cur[1] == ')' || (ctxt->cur[1] == '(')) || (ctxt->cur[1] == '^')) &&
                 (*ctxt->cur != '\0')))) {
          ctxt->cur = ctxt->cur + 1;
        }
        pxVar5 = _level + 1;
        *_level = *ctxt->cur;
        _level = pxVar5;
        if (*ctxt->cur != '\0') {
          ctxt->cur = ctxt->cur + 1;
        }
      }
      *_level = '\0';
      if (((int)oldBase == 0) || (*ctxt->cur != '\0')) {
        iVar2 = xmlStrEqual(buffer,(xmlChar *)"xpointer");
        if ((iVar2 == 0) && (iVar2 = xmlStrEqual(buffer,(xmlChar *)"xpath1"), iVar2 == 0)) {
          iVar2 = xmlStrEqual(buffer,"element");
          if (iVar2 == 0) {
            iVar2 = xmlStrEqual(buffer,"xmlns");
            if (iVar2 == 0) {
              xmlXPtrErr(ctxt,0x76c,"unsupported scheme \'%s\'\n",buffer);
            }
            else {
              pxVar5 = ctxt->base;
              pxVar1 = ctxt->cur;
              ctxt->base = pxVar3;
              ctxt->cur = pxVar3;
              pxVar4 = xmlXPathParseNCName(ctxt);
              if (pxVar4 == (xmlChar *)0x0) {
                ctxt->base = pxVar5;
                ctxt->cur = pxVar1;
                (*xmlFree)(pxVar3);
                (*xmlFree)(buffer);
                xmlXPathErr(ctxt,0x10);
                return;
              }
              while( true ) {
                bVar6 = true;
                if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar6 = true, 10 < *ctxt->cur)))) {
                  bVar6 = *ctxt->cur == '\r';
                }
                if (!bVar6) break;
                if (*ctxt->cur != '\0') {
                  ctxt->cur = ctxt->cur + 1;
                }
              }
              if (*ctxt->cur != '=') {
                ctxt->base = pxVar5;
                ctxt->cur = pxVar1;
                (*xmlFree)(pxVar4);
                (*xmlFree)(pxVar3);
                (*xmlFree)(buffer);
                xmlXPathErr(ctxt,0x10);
                return;
              }
              if (*ctxt->cur != '\0') {
                ctxt->cur = ctxt->cur + 1;
              }
              while( true ) {
                bVar6 = true;
                if ((*ctxt->cur != ' ') && ((*ctxt->cur < 9 || (bVar6 = true, 10 < *ctxt->cur)))) {
                  bVar6 = *ctxt->cur == '\r';
                }
                if (!bVar6) break;
                if (*ctxt->cur != '\0') {
                  ctxt->cur = ctxt->cur + 1;
                }
              }
              iVar2 = xmlXPathRegisterNs(ctxt->context,pxVar4,ctxt->cur);
              if (iVar2 < 0) {
                xmlXPathPErrMemory(ctxt);
              }
              ctxt->base = pxVar5;
              ctxt->cur = pxVar1;
              (*xmlFree)(pxVar4);
            }
          }
          else {
            pxVar5 = ctxt->base;
            pxVar1 = ctxt->cur;
            ctxt->base = pxVar3;
            ctxt->cur = pxVar3;
            if (*pxVar3 == '/') {
              xmlXPathRoot(ctxt);
              xmlXPtrEvalChildSeq(ctxt,(xmlChar *)0x0);
            }
            else {
              pxVar4 = xmlXPathParseName(ctxt);
              if (pxVar4 == (xmlChar *)0x0) {
                ctxt->base = pxVar5;
                ctxt->cur = pxVar1;
                (*xmlFree)(pxVar3);
                (*xmlFree)(buffer);
                xmlXPathErr(ctxt,7);
                return;
              }
              xmlXPtrEvalChildSeq(ctxt,pxVar4);
            }
            ctxt->base = pxVar5;
            ctxt->cur = pxVar1;
          }
        }
        else {
          pxVar5 = ctxt->base;
          pxVar1 = ctxt->cur;
          ctxt->base = pxVar3;
          ctxt->cur = pxVar3;
          ctxt->context->node = (xmlNodePtr)ctxt->context->doc;
          ctxt->context->proximityPosition = 1;
          ctxt->context->contextSize = 1;
          xmlXPathEvalExpr(ctxt);
          ctxt->base = pxVar5;
          ctxt->cur = pxVar1;
        }
        (*xmlFree)(pxVar3);
        (*xmlFree)(buffer);
      }
      else {
        (*xmlFree)(buffer);
        (*xmlFree)(pxVar3);
        xmlXPathErr(ctxt,0x10);
      }
    }
  }
  else {
    (*xmlFree)(buffer);
    xmlXPathErr(ctxt,7);
  }
  return;
}

Assistant:

static void
xmlXPtrEvalXPtrPart(xmlXPathParserContextPtr ctxt, xmlChar *name) {
    xmlChar *buffer, *cur;
    int len;
    int level;

    if (name == NULL)
    name = xmlXPathParseName(ctxt);
    if (name == NULL)
	XP_ERROR(XPATH_EXPR_ERROR);

    if (CUR != '(') {
        xmlFree(name);
	XP_ERROR(XPATH_EXPR_ERROR);
    }
    NEXT;
    level = 1;

    len = xmlStrlen(ctxt->cur);
    len++;
    buffer = xmlMalloc(len);
    if (buffer == NULL) {
        xmlXPathPErrMemory(ctxt);
        xmlFree(name);
	return;
    }

    cur = buffer;
    while (CUR != 0) {
	if (CUR == ')') {
	    level--;
	    if (level == 0) {
		NEXT;
		break;
	    }
	} else if (CUR == '(') {
	    level++;
	} else if (CUR == '^') {
            if ((NXT(1) == ')') || (NXT(1) == '(') || (NXT(1) == '^')) {
                NEXT;
            }
	}
        *cur++ = CUR;
	NEXT;
    }
    *cur = 0;

    if ((level != 0) && (CUR == 0)) {
        xmlFree(name);
	xmlFree(buffer);
	XP_ERROR(XPTR_SYNTAX_ERROR);
    }

    if (xmlStrEqual(name, (xmlChar *) "xpointer") ||
        xmlStrEqual(name, (xmlChar *) "xpath1")) {
	const xmlChar *oldBase = ctxt->base;
	const xmlChar *oldCur = ctxt->cur;

	ctxt->cur = ctxt->base = buffer;
	/*
	 * To evaluate an xpointer scheme element (4.3) we need:
	 *   context initialized to the root
	 *   context position initialized to 1
	 *   context size initialized to 1
	 */
	ctxt->context->node = (xmlNodePtr)ctxt->context->doc;
	ctxt->context->proximityPosition = 1;
	ctxt->context->contextSize = 1;
	xmlXPathEvalExpr(ctxt);
	ctxt->base = oldBase;
        ctxt->cur = oldCur;
    } else if (xmlStrEqual(name, (xmlChar *) "element")) {
	const xmlChar *oldBase = ctxt->base;
	const xmlChar *oldCur = ctxt->cur;
	xmlChar *name2;

	ctxt->cur = ctxt->base = buffer;
	if (buffer[0] == '/') {
	    xmlXPathRoot(ctxt);
	    xmlXPtrEvalChildSeq(ctxt, NULL);
	} else {
	    name2 = xmlXPathParseName(ctxt);
	    if (name2 == NULL) {
                ctxt->base = oldBase;
                ctxt->cur = oldCur;
		xmlFree(buffer);
                xmlFree(name);
		XP_ERROR(XPATH_EXPR_ERROR);
	    }
	    xmlXPtrEvalChildSeq(ctxt, name2);
	}
	ctxt->base = oldBase;
        ctxt->cur = oldCur;
#ifdef XPTR_XMLNS_SCHEME
    } else if (xmlStrEqual(name, (xmlChar *) "xmlns")) {
	const xmlChar *oldBase = ctxt->base;
	const xmlChar *oldCur = ctxt->cur;
	xmlChar *prefix;

	ctxt->cur = ctxt->base = buffer;
        prefix = xmlXPathParseNCName(ctxt);
	if (prefix == NULL) {
            ctxt->base = oldBase;
            ctxt->cur = oldCur;
	    xmlFree(buffer);
	    xmlFree(name);
	    XP_ERROR(XPTR_SYNTAX_ERROR);
	}
	SKIP_BLANKS;
	if (CUR != '=') {
            ctxt->base = oldBase;
            ctxt->cur = oldCur;
	    xmlFree(prefix);
	    xmlFree(buffer);
	    xmlFree(name);
	    XP_ERROR(XPTR_SYNTAX_ERROR);
	}
	NEXT;
	SKIP_BLANKS;

	if (xmlXPathRegisterNs(ctxt->context, prefix, ctxt->cur) < 0)
            xmlXPathPErrMemory(ctxt);
        ctxt->base = oldBase;
        ctxt->cur = oldCur;
	xmlFree(prefix);
#endif /* XPTR_XMLNS_SCHEME */
    } else {
        xmlXPtrErr(ctxt, XML_XPTR_UNKNOWN_SCHEME,
		   "unsupported scheme '%s'\n", name);
    }
    xmlFree(buffer);
    xmlFree(name);
}